

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.h
# Opt level: O0

bool __thiscall llvm::yaml::isBool(yaml *this,StringRef S)

{
  bool bVar1;
  bool local_79;
  StringRef local_78;
  StringRef local_68;
  StringRef local_58;
  StringRef local_48;
  StringRef local_38;
  StringRef local_28;
  undefined1 local_18 [8];
  StringRef S_local;
  
  S_local.Data = S.Data;
  local_18 = (undefined1  [8])this;
  StringRef::StringRef(&local_28,"true");
  bVar1 = StringRef::equals((StringRef *)local_18,local_28);
  local_79 = true;
  if (!bVar1) {
    StringRef::StringRef(&local_38,"True");
    bVar1 = StringRef::equals((StringRef *)local_18,local_38);
    local_79 = true;
    if (!bVar1) {
      StringRef::StringRef(&local_48,"TRUE");
      bVar1 = StringRef::equals((StringRef *)local_18,local_48);
      local_79 = true;
      if (!bVar1) {
        StringRef::StringRef(&local_58,"false");
        bVar1 = StringRef::equals((StringRef *)local_18,local_58);
        local_79 = true;
        if (!bVar1) {
          StringRef::StringRef(&local_68,"False");
          bVar1 = StringRef::equals((StringRef *)local_18,local_68);
          local_79 = true;
          if (!bVar1) {
            StringRef::StringRef(&local_78,"FALSE");
            local_79 = StringRef::equals((StringRef *)local_18,local_78);
          }
        }
      }
    }
  }
  return local_79;
}

Assistant:

inline bool isBool(StringRef S) {
  return S.equals("true") || S.equals("True") || S.equals("TRUE") ||
         S.equals("false") || S.equals("False") || S.equals("FALSE");
}